

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

upb_Message_DeleteUnknownStatus
upb_Message_DeleteUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter,upb_Arena *arena)

{
  uintptr_t uVar1;
  _Bool _Var2;
  upb_Message_Internal *puVar3;
  upb_StringView *sv;
  upb_Message_Internal uVar4;
  upb_StringView *sv_00;
  upb_Message_Internal uVar5;
  upb_StringView *suffix;
  upb_StringView *prefix;
  upb_StringView *unknown;
  upb_TaggedAuxPtr unknown_ptr;
  upb_Message_Internal *in;
  upb_Arena *arena_local;
  uintptr_t *iter_local;
  upb_StringView *data_local;
  upb_Message *msg_local;
  
  _Var2 = upb_Message_IsFrozen(msg);
  if (_Var2) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb0,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (*iter == 0) {
    __assert_fail("*iter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb1,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  puVar3 = _upb_Message_GetInternal_dont_copy_me__upb_internal_use_only(msg);
  if (puVar3 == (upb_Message_Internal *)0x0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb3,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (*iter <= (ulong)puVar3->size) {
    uVar4 = puVar3[*iter];
    _Var2 = upb_TaggedAuxPtr_IsUnknown((upb_TaggedAuxPtr)uVar4);
    if (!_Var2) {
      __assert_fail("upb_TaggedAuxPtr_IsUnknown(unknown_ptr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                    ,0xb6,
                    "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                   );
    }
    sv = upb_TaggedAuxPtr_UnknownData((upb_TaggedAuxPtr)uVar4);
    if ((sv->data == data->data) && (sv->size == data->size)) {
      uVar1 = *iter;
      uVar4 = (upb_Message_Internal)upb_TaggedAuxPtr_Null();
      puVar3[uVar1] = uVar4;
    }
    else {
      if (sv->data == data->data) {
        sv->data = sv->data + data->size;
        sv->size = sv->size - data->size;
        data->data = sv->data;
        data->size = sv->size;
        return kUpb_DeleteUnknown_IterUpdated;
      }
      if (sv->data + sv->size == data->data + data->size) {
        sv->size = sv->size - data->size;
        _Var2 = upb_TaggedAuxPtr_IsUnknownAliased((upb_TaggedAuxPtr)uVar4);
        if (!_Var2) {
          uVar1 = *iter;
          uVar4 = (upb_Message_Internal)upb_TaggedAuxPtr_MakeUnknownDataAliased(sv);
          puVar3[uVar1] = uVar4;
        }
      }
      else {
        if ((data->data <= sv->data) || (sv->data + sv->size <= data->data + data->size)) {
          __assert_fail("unknown->data < data->data && unknown->data + unknown->size > data->data + data->size"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                        ,0xca,
                        "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                       );
        }
        sv_00 = (upb_StringView *)upb_Arena_Malloc(arena,0x10);
        if (sv_00 == (upb_StringView *)0x0) {
          return kUpb_DeleteUnknown_AllocFail;
        }
        _Var2 = _upb_Message_ReserveSlot_dont_copy_me__upb_internal_use_only(msg,arena);
        if (!_Var2) {
          return kUpb_DeleteUnknown_AllocFail;
        }
        puVar3 = _upb_Message_GetInternal_dont_copy_me__upb_internal_use_only(msg);
        if (*iter != (ulong)puVar3->size) {
          memmove(puVar3 + *iter + 2,puVar3 + *iter + 1,((ulong)puVar3->size - *iter) * 8);
        }
        uVar1 = *iter;
        uVar5 = (upb_Message_Internal)upb_TaggedAuxPtr_MakeUnknownDataAliased(sv_00);
        puVar3[uVar1 + 1] = uVar5;
        _Var2 = upb_TaggedAuxPtr_IsUnknownAliased((upb_TaggedAuxPtr)uVar4);
        if (!_Var2) {
          uVar1 = *iter;
          uVar4 = (upb_Message_Internal)upb_TaggedAuxPtr_MakeUnknownDataAliased(sv);
          puVar3[uVar1] = uVar4;
        }
        puVar3->size = puVar3->size + 1;
        sv_00->data = data->data + data->size;
        sv_00->size = (size_t)(sv->data + (sv->size - (long)sv_00->data));
        sv->size = (long)data->data - (long)sv->data;
      }
    }
    _Var2 = upb_Message_NextUnknown(msg,data,iter);
    return (uint)_Var2;
  }
  __assert_fail("*iter <= in->size",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                ,0xb4,
                "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
               );
}

Assistant:

upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message* msg,
                                                          upb_StringView* data,
                                                          uintptr_t* iter,
                                                          upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSERT(*iter != kUpb_Message_UnknownBegin);
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  UPB_ASSERT(in);
  UPB_ASSERT(*iter <= in->size);
  upb_TaggedAuxPtr unknown_ptr = in->aux_data[*iter - 1];
  UPB_ASSERT(upb_TaggedAuxPtr_IsUnknown(unknown_ptr));
  upb_StringView* unknown = upb_TaggedAuxPtr_UnknownData(unknown_ptr);
  if (unknown->data == data->data && unknown->size == data->size) {
    // Remove whole field
    in->aux_data[*iter - 1] = upb_TaggedAuxPtr_Null();
  } else if (unknown->data == data->data) {
    // Strip prefix
    unknown->data += data->size;
    unknown->size -= data->size;
    *data = *unknown;
    return kUpb_DeleteUnknown_IterUpdated;
  } else if (unknown->data + unknown->size == data->data + data->size) {
    // Truncate existing field
    unknown->size -= data->size;
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] =
          upb_TaggedAuxPtr_MakeUnknownDataAliased(unknown);
    }
  } else {
    UPB_ASSERT(unknown->data < data->data &&
               unknown->data + unknown->size > data->data + data->size);
    // Split in the middle
    upb_StringView* prefix = unknown;
    upb_StringView* suffix = upb_Arena_Malloc(arena, sizeof(upb_StringView));
    if (!suffix) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    if (!UPB_PRIVATE(_upb_Message_ReserveSlot)(msg, arena)) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
    if (*iter != in->size) {
      // Shift later entries down so that unknown field ordering is preserved
      memmove(&in->aux_data[*iter + 1], &in->aux_data[*iter],
              sizeof(upb_TaggedAuxPtr) * (in->size - *iter));
    }
    in->aux_data[*iter] = upb_TaggedAuxPtr_MakeUnknownDataAliased(suffix);
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] = upb_TaggedAuxPtr_MakeUnknownDataAliased(prefix);
    }
    in->size++;
    suffix->data = data->data + data->size;
    suffix->size = (prefix->data + prefix->size) - suffix->data;
    prefix->size = data->data - prefix->data;
  }
  return upb_Message_NextUnknown(msg, data, iter)
             ? kUpb_DeleteUnknown_IterUpdated
             : kUpb_DeleteUnknown_DeletedLast;
}